

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

bool boost::ext::ut::v1_1_8::detail::
     on<boost::ext::ut::v1_1_8::detail::eq_<int,boost::ext::ut::v1_1_8::detail::integral_constant<_3>>,boost::ext::ut::v1_1_8::events::assertion<boost::ext::ut::v1_1_8::detail::eq_<int,boost::ext::ut::v1_1_8::detail::integral_constant<_3>>>>
               (assertion<boost::ext::ut::v1_1_8::detail::eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<_3>_>_>
                *event)

{
  undefined8 uVar1;
  assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<int,_boost::ext::ut::v1_1_8::detail::integral_constant<_3>_>_>
  assertion;
  undefined4 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  undefined2 uStack_22;
  undefined4 uStack_14;
  undefined2 uStack_8;
  undefined4 uStack_6;
  
  uVar2 = (event->expr).lhs_;
  uVar3 = (event->expr).field_0x4;
  uVar4 = (event->expr).value_;
  assertion.expr.value_ = (bool)uVar4;
  assertion.expr._4_1_ = uVar3;
  assertion.expr.lhs_ = uVar2;
  uVar1 = *(undefined8 *)((long)&(event->location).file_ + 4);
  uStack_8 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_6 = (undefined4)((ulong)uVar1 >> 0x20);
  bVar5 = true;
  if (cfg<boost::ext::ut::v1_1_8::override>[0x348] == '\0') {
    if (((event->expr).value_ & 1U) == 0) {
      cfg<boost::ext::ut::v1_1_8::override>._528_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._528_8_ + 1;
      assertion.location.file_._6_2_ = uStack_8;
      assertion.location.file_._0_6_ =
           (int6)((ulong)*(undefined8 *)&(event->expr).field_0x6 >> 0x10);
      assertion.location._12_4_ = uStack_14;
      assertion.location.line_ = uStack_6;
      assertion.expr._6_2_ = uStack_22;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<int,boost::ext::ut::v1_1_8::detail::integral_constant<_3>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)cfg<boost::ext::ut::v1_1_8::override>,
                 assertion);
      bVar5 = false;
    }
    else {
      cfg<boost::ext::ut::v1_1_8::override>._24_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._24_8_ + 1;
    }
  }
  return bVar5;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}